

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall t_ocaml_generator::generate_const(t_ocaml_generator *this,t_const *tconst)

{
  t_type *type;
  t_const_value *value;
  ostream *poVar1;
  string name;
  string local_90;
  string local_70;
  string local_50;
  
  type = tconst->type_;
  std::__cxx11::string::string((string *)&local_50,(string *)&tconst->name_);
  t_generator::decapitalize(&local_70,(t_generator *)this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  value = tconst->value_;
  poVar1 = t_generator::indent((t_generator *)this,(ostream *)&this->f_consts_);
  poVar1 = std::operator<<(poVar1,"let ");
  poVar1 = std::operator<<(poVar1,(string *)&local_70);
  poVar1 = std::operator<<(poVar1," = ");
  render_const_value_abi_cxx11_(&local_90,this,type,value);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void t_ocaml_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = decapitalize(tconst->get_name());
  t_const_value* value = tconst->get_value();

  indent(f_consts_) << "let " << name << " = " << render_const_value(type, value) << endl << endl;
}